

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *s;
  cmCTest *pcVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  pointer __lhs;
  char *local_570 [4];
  ostringstream cmCTestLog_msg_3;
  cmCTestTestProperties test;
  
  s = (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
  poVar4 = std::operator<<((ostream *)&test,"Add test: ");
  poVar4 = std::operator<<(poVar4,(string *)
                                  (args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x9cf,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&test);
  if (((this->UseExcludeRegExpFlag == true) && (this->UseExcludeRegExpFirst == true)) &&
     (bVar2 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,s), bVar2)) {
    return true;
  }
  __lhs = (this->CustomTestsIgnore).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (this->MemCheck == false) {
    for (; __lhs != (this->CustomTestsIgnore).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var3 = std::operator==(__lhs,s);
      if (_Var3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
        poVar4 = std::operator<<((ostream *)&test,"Ignore test: ");
        poVar4 = std::operator<<(poVar4,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x9f0,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
        goto LAB_002034dc;
      }
    }
  }
  else {
    for (; __lhs != (this->CustomTestsIgnore).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var3 = std::operator==(__lhs,s);
      if (_Var3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
        poVar4 = std::operator<<((ostream *)&test,"Ignore memcheck: ");
        poVar4 = std::operator<<(poVar4,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x9e1,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
LAB_002034dc:
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&test);
        return true;
      }
    }
  }
  cmCTestTestProperties::cmCTestTestProperties(&test);
  std::__cxx11::string::_M_assign((string *)&test.Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&test.Args,args);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&test.Directory,(string *)&cmCTestLog_msg_3);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_3,"Set test directory: ");
  poVar4 = std::operator<<(poVar4,(string *)&test.Directory);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x9fb,local_570[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_570);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
  if ((this->UseIncludeRegExpFlag == true) &&
     ((bVar2 = cmsys::RegularExpression::find(&this->IncludeTestsRegularExpression,s), !bVar2 ||
      ((this->UseExcludeRegExpFirst == false &&
       (bVar2 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,s), bVar2))))))
  {
    test.IsInBasedOnREOptions = false;
  }
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::push_back(&this->TestList,&test);
  cmCTestTestProperties::~cmCTestTestProperties(&test);
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
                     this->Quiet);

  if (this->UseExcludeRegExpFlag && this->UseExcludeRegExpFirst &&
      this->ExcludeTestsRegularExpression.find(testname)) {
    return true;
  }
  if (this->MemCheck) {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
    }
  } else {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore test: " << *it << std::endl, this->Quiet);
      return true;
    }
  }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Set test directory: " << test.Directory << std::endl,
                     this->Quiet);

  if (this->UseIncludeRegExpFlag &&
      (!this->IncludeTestsRegularExpression.find(testname) ||
       (!this->UseExcludeRegExpFirst &&
        this->ExcludeTestsRegularExpression.find(testname)))) {
    test.IsInBasedOnREOptions = false;
  }
  this->TestList.push_back(test);
  return true;
}